

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>::format
          (source_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  fmt_helper *this_00;
  size_t wrapped_size;
  char *pcVar1;
  memory_buf_t *dest_00;
  string_view_t view;
  scoped_padder p;
  scoped_padder local_40;
  
  if ((msg->source).line != 0) {
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      wrapped_size = strlen((msg->source).filename);
    }
    else {
      wrapped_size = 0;
    }
    dest_00 = dest;
    scoped_padder::scoped_padder(&local_40,wrapped_size,&(this->super_flag_formatter).padinfo_,dest)
    ;
    this_00 = (fmt_helper *)(msg->source).filename;
    pcVar1 = (char *)strlen((char *)this_00);
    view.size_ = (size_t)dest;
    view.data_ = pcVar1;
    fmt_helper::append_string_view(this_00,view,dest_00);
    scoped_padder::~scoped_padder(&local_40);
  }
  return;
}

Assistant:

explicit B_formatter(padding_info padinfo)
        : flag_formatter(padinfo)
    {}